

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O3

void __thiscall chrono::robosimian::RoboSimian::Create(RoboSimian *this,bool has_sled,bool fixed)

{
  shared_ptr<chrono::ChMaterialSurface> *__args_3;
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,_std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>_>_>
  *this_00;
  shared_ptr<chrono::ChMaterialSurface> *__args_4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  RS_Part *this_01;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  ChContactMethod contact_method;
  ChContactMethod contact_method_00;
  undefined1 local_4a;
  bool fixed_local;
  shared_ptr<chrono::robosimian::RS_Limb> local_48;
  LimbID local_34;
  
  fixed_local = fixed;
  contact_method = (**(code **)(*(long *)this->m_system + 0x178))();
  contact_method_00 = contact_method;
  if (contact_method == NSC) {
    chrono::collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
    chrono::collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
    contact_method_00 = NSC;
  }
  DefaultContactMaterial((robosimian *)&local_48,contact_method_00);
  p_Var1 = (this->m_chassis_material).
           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_chassis_material).
  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->m_chassis_material).
  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  DefaultContactMaterial((robosimian *)&local_48,contact_method);
  p_Var1 = (this->m_sled_material).
           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_sled_material).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (this->m_sled_material).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  DefaultContactMaterial((robosimian *)&local_48,contact_method);
  p_Var1 = (this->m_wheel_material).
           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_wheel_material).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)
            local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  (this->m_wheel_material).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  DefaultContactMaterial((robosimian *)&local_48,contact_method);
  p_Var1 = (this->m_link_material).
           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_link_material).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)
           local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  (this->m_link_material).super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  DefaultContactMaterial((robosimian *)&local_48,contact_method);
  p_Var1 = (this->m_wheelDD_material).
           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->m_wheelDD_material).
  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->m_wheelDD_material).
  super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::robosimian::RS_Chassis,std::allocator<chrono::robosimian::RS_Chassis>,char_const(&)[8],bool&,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
            (&local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(RS_Chassis **)&local_48,
             (allocator<chrono::robosimian::RS_Chassis> *)&local_34,(char (*) [8])0x1697e4,
             &fixed_local,&this->m_chassis_material,&this->m_system);
  _Var3._M_pi = local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi;
  peVar2 = local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->m_chassis).
           super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_chassis).super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)peVar2;
  (this->m_chassis).super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var3._M_pi;
  if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
     (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
     local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
     _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  __args_3 = &this->m_wheel_material;
  __args_4 = &this->m_link_material;
  if (has_sled) {
    local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<chrono::robosimian::RS_Sled,std::allocator<chrono::robosimian::RS_Sled>,char_const(&)[5],std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
              (&local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,(RS_Sled **)&local_48,
               (allocator<chrono::robosimian::RS_Sled> *)&local_34,(char (*) [5])0x169806,
               &this->m_sled_material,&this->m_system);
    _Var3._M_pi = local_48.
                  super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    peVar2 = local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_refcount
    ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (this->m_sled).
             super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>._M_refcount
             ._M_pi;
    (this->m_sled).super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)peVar2;
    (this->m_sled).super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Var3._M_pi;
    if ((p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1),
       local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.
                 super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  this_00 = &this->m_limbs;
  local_34 = FR;
  local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::robosimian::RS_Limb,std::allocator<chrono::robosimian::RS_Limb>,char_const(&)[6],chrono::robosimian::LimbID,chrono::robosimian::LinkData_const(&)[11],std::shared_ptr<chrono::ChMaterialSurface>&,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
            (&local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(RS_Limb **)&local_48,(allocator<chrono::robosimian::RS_Limb> *)&local_4a,
             (char (*) [6])"limb1",&local_34,(LinkData (*) [11])front_links,__args_3,__args_4,
             &this->m_system);
  std::
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
  ::emplace_back<std::shared_ptr<chrono::robosimian::RS_Limb>>
            ((vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
              *)this_00,&local_48);
  if (local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_34 = RR;
  local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::robosimian::RS_Limb,std::allocator<chrono::robosimian::RS_Limb>,char_const(&)[6],chrono::robosimian::LimbID,chrono::robosimian::LinkData_const(&)[11],std::shared_ptr<chrono::ChMaterialSurface>&,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
            (&local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(RS_Limb **)&local_48,(allocator<chrono::robosimian::RS_Limb> *)&local_4a,
             (char (*) [6])"limb2",&local_34,(LinkData (*) [11])rear_links,__args_3,__args_4,
             &this->m_system);
  std::
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
  ::emplace_back<std::shared_ptr<chrono::robosimian::RS_Limb>>
            ((vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
              *)this_00,&local_48);
  if (local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_34 = RL;
  local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::robosimian::RS_Limb,std::allocator<chrono::robosimian::RS_Limb>,char_const(&)[6],chrono::robosimian::LimbID,chrono::robosimian::LinkData_const(&)[11],std::shared_ptr<chrono::ChMaterialSurface>&,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
            (&local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(RS_Limb **)&local_48,(allocator<chrono::robosimian::RS_Limb> *)&local_4a,
             (char (*) [6])"limb3",&local_34,(LinkData (*) [11])rear_links,__args_3,__args_4,
             &this->m_system);
  std::
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
  ::emplace_back<std::shared_ptr<chrono::robosimian::RS_Limb>>
            ((vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
              *)this_00,&local_48);
  if (local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_34 = FL;
  local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chrono::robosimian::RS_Limb,std::allocator<chrono::robosimian::RS_Limb>,char_const(&)[6],chrono::robosimian::LimbID,chrono::robosimian::LinkData_const(&)[11],std::shared_ptr<chrono::ChMaterialSurface>&,std::shared_ptr<chrono::ChMaterialSurface>&,chrono::ChSystem*&>
            (&local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(RS_Limb **)&local_48,(allocator<chrono::robosimian::RS_Limb> *)&local_4a,
             (char (*) [6])"limb4",&local_34,(LinkData (*) [11])front_links,__args_3,__args_4,
             &this->m_system);
  std::
  vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
  ::emplace_back<std::shared_ptr<chrono::robosimian::RS_Limb>>
            ((vector<std::shared_ptr<chrono::robosimian::RS_Limb>,std::allocator<std::shared_ptr<chrono::robosimian::RS_Limb>>>
              *)this_00,&local_48);
  if (local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::robosimian::RS_Limb,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  RS_Part::SetVisualizationType
            (&((this->m_chassis).
               super___shared_ptr<chrono::robosimian::RS_Chassis,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              )->super_RS_Part,COLLISION);
  this_01 = &((this->m_sled).
              super___shared_ptr<chrono::robosimian::RS_Sled,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             super_RS_Part;
  if (this_01 != (RS_Part *)0x0) {
    RS_Part::SetVisualizationType(this_01,COLLISION);
  }
  SetVisualizationTypeLimbs(this,COLLISION);
  return;
}

Assistant:

void RoboSimian::Create(bool has_sled, bool fixed) {
    auto contact_method = m_system->GetContactMethod();

    // Set default collision model envelope commensurate with model dimensions.
    // Note that an SMC system automatically sets envelope to 0.
    if (contact_method == ChContactMethod::NSC) {
        collision::ChCollisionModel::SetDefaultSuggestedEnvelope(0.01);
        collision::ChCollisionModel::SetDefaultSuggestedMargin(0.005);
    }

    // Create the contact materials (all with default properties)
    m_chassis_material = DefaultContactMaterial(contact_method);
    m_sled_material = DefaultContactMaterial(contact_method);
    m_wheel_material = DefaultContactMaterial(contact_method);
    m_link_material = DefaultContactMaterial(contact_method);
    m_wheelDD_material = DefaultContactMaterial(contact_method);

    m_chassis = chrono_types::make_shared<RS_Chassis>("chassis", fixed, m_chassis_material, m_system);

    if (has_sled)
        m_sled = chrono_types::make_shared<RS_Sled>("sled", m_sled_material, m_system);

    m_limbs.push_back(
        chrono_types::make_shared<RS_Limb>("limb1", FR, front_links, m_wheel_material, m_link_material, m_system));
    m_limbs.push_back(
        chrono_types::make_shared<RS_Limb>("limb2", RR, rear_links, m_wheel_material, m_link_material, m_system));
    m_limbs.push_back(
        chrono_types::make_shared<RS_Limb>("limb3", RL, rear_links, m_wheel_material, m_link_material, m_system));
    m_limbs.push_back(
        chrono_types::make_shared<RS_Limb>("limb4", FL, front_links, m_wheel_material, m_link_material, m_system));

    // The differential-drive wheels will be removed from robosimian
    ////m_wheel_left = chrono_types::make_shared<RS_WheelDD>("dd_wheel_left", 2, m_wheelDD_material, m_system);
    ////m_wheel_right = chrono_types::make_shared<RS_WheelDD>("dd_wheel_right", 3, m_wheelDD_material, m_system);

    // Default visualization: COLLISION shapes
    SetVisualizationTypeChassis(VisualizationType::COLLISION);
    SetVisualizationTypeSled(VisualizationType::COLLISION);
    SetVisualizationTypeLimbs(VisualizationType::COLLISION);
    SetVisualizationTypeWheels(VisualizationType::COLLISION);
}